

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O3

void ym2610b_update_one(void *chip,UINT32 length,DEV_SMPL **buffer)

{
  FM_OPN *OPN;
  FM_CH *CH;
  FM_CH *CH_00;
  FM_CH *CH_01;
  FM_CH *CH_02;
  FM_CH *CH_03;
  FM_CH *CH_04;
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  UINT8 UVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int chnum;
  int chnum_00;
  int chnum_01;
  int chnum_02;
  int chnum_03;
  uint uVar10;
  ulong extraout_RDX;
  ulong uVar11;
  ulong extraout_RDX_00;
  UINT8 UVar12;
  byte bVar13;
  FM_SLOT *SLOT;
  ulong uVar14;
  DEV_SMPL *local_78;
  DEV_SMPL *local_70;
  
  OPN = (FM_OPN *)((long)chip + 0x208);
  if (buffer == (DEV_SMPL **)0x0) {
    local_70 = (DEV_SMPL *)0x0;
    local_78 = (DEV_SMPL *)0x0;
  }
  else {
    local_78 = *buffer;
    local_70 = buffer[1];
  }
  CH = (FM_CH *)((long)chip + 0x4778);
  CH_00 = (FM_CH *)((long)chip + 0x4910);
  CH_01 = (FM_CH *)((long)chip + 0x4aa8);
  CH_02 = (FM_CH *)((long)chip + 0x4c40);
  CH_03 = (FM_CH *)((long)chip + 0x4dd8);
  CH_04 = (FM_CH *)((long)chip + 0x4f70);
  refresh_fc_eg_chan(OPN,CH);
  refresh_fc_eg_chan(OPN,CH_00);
  if ((*(byte *)((long)chip + 0x230) & 0xc0) == 0) {
    refresh_fc_eg_chan(OPN,CH_01);
  }
  else if (*(int *)((long)chip + 0x4ad0) == -1) {
    iVar7 = *(int *)(*(long *)((long)chip + 0x4aa8) + (ulong)*(byte *)((long)chip + 0x68e) * 4) +
            *(int *)((long)chip + 0x684);
    if (iVar7 < 0) {
      iVar7 = iVar7 + *(int *)((long)chip + 0x46e8);
    }
    *(uint *)((long)chip + 0x4ad0) = (uint)(iVar7 * *(int *)((long)chip + 0x4ac8)) >> 1;
    bVar6 = *(byte *)((long)chip + 0x68e) >> (*(byte *)((long)chip + 0x4ab0) & 0x1f);
    uVar2 = (uint)bVar6;
    if (uVar2 != *(byte *)((long)chip + 0x4ac4)) {
      *(byte *)((long)chip + 0x4ac4) = bVar6;
      uVar9 = *(int *)((long)chip + 0x4ab4) + uVar2;
      if (uVar9 < 0x5e) {
        UVar5 = "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                [uVar9];
        UVar12 = eg_rate_select[uVar9];
      }
      else {
        UVar12 = 0x90;
        UVar5 = '\0';
      }
      *(UINT8 *)((long)chip + 0x4ae8) = UVar5;
      *(UINT8 *)((long)chip + 0x4ae9) = UVar12;
      uVar9 = *(int *)((long)chip + 0x4ab8) + uVar2;
      *(UINT8 *)((long)chip + 0x4aea) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar9];
      *(UINT8 *)((long)chip + 0x4aeb) = eg_rate_select[uVar9];
      uVar9 = *(int *)((long)chip + 0x4abc) + uVar2;
      *(UINT8 *)((long)chip + 0x4aec) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar9];
      *(UINT8 *)((long)chip + 0x4aed) = eg_rate_select[uVar9];
      uVar2 = uVar2 + *(int *)((long)chip + 0x4ac0);
      *(UINT8 *)((long)chip + 0x4aee) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar2];
      *(UINT8 *)((long)chip + 0x4aef) = eg_rate_select[uVar2];
    }
    iVar7 = *(int *)(*(long *)((long)chip + 0x4b48) + (ulong)*(byte *)((long)chip + 0x68f) * 4) +
            *(int *)((long)chip + 0x688);
    if (iVar7 < 0) {
      iVar7 = iVar7 + *(int *)((long)chip + 0x46e8);
    }
    *(uint *)((long)chip + 0x4b70) = (uint)(iVar7 * *(int *)((long)chip + 0x4b68)) >> 1;
    bVar6 = *(byte *)((long)chip + 0x68f) >> (*(byte *)((long)chip + 0x4b50) & 0x1f);
    uVar2 = (uint)bVar6;
    if (uVar2 != *(byte *)((long)chip + 0x4b64)) {
      *(byte *)((long)chip + 0x4b64) = bVar6;
      uVar9 = *(int *)((long)chip + 0x4b54) + uVar2;
      if (uVar9 < 0x5e) {
        UVar5 = "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                [uVar9];
        UVar12 = eg_rate_select[uVar9];
      }
      else {
        UVar12 = 0x90;
        UVar5 = '\0';
      }
      *(UINT8 *)((long)chip + 0x4b88) = UVar5;
      *(UINT8 *)((long)chip + 0x4b89) = UVar12;
      uVar9 = *(int *)((long)chip + 0x4b58) + uVar2;
      *(UINT8 *)((long)chip + 0x4b8a) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar9];
      *(UINT8 *)((long)chip + 0x4b8b) = eg_rate_select[uVar9];
      uVar9 = *(int *)((long)chip + 0x4b5c) + uVar2;
      *(UINT8 *)((long)chip + 0x4b8c) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar9];
      *(UINT8 *)((long)chip + 0x4b8d) = eg_rate_select[uVar9];
      uVar2 = uVar2 + *(int *)((long)chip + 0x4b60);
      *(UINT8 *)((long)chip + 0x4b8e) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar2];
      *(UINT8 *)((long)chip + 0x4b8f) = eg_rate_select[uVar2];
    }
    iVar7 = *(int *)(*(long *)((long)chip + 0x4af8) + (ulong)*(byte *)((long)chip + 0x68d) * 4) +
            *(int *)((long)chip + 0x680);
    if (iVar7 < 0) {
      iVar7 = iVar7 + *(int *)((long)chip + 0x46e8);
    }
    *(uint *)((long)chip + 0x4b20) = (uint)(iVar7 * *(int *)((long)chip + 0x4b18)) >> 1;
    bVar6 = *(byte *)((long)chip + 0x68d) >> (*(byte *)((long)chip + 0x4b00) & 0x1f);
    uVar2 = (uint)bVar6;
    if (uVar2 != *(byte *)((long)chip + 0x4b14)) {
      *(byte *)((long)chip + 0x4b14) = bVar6;
      uVar9 = *(int *)((long)chip + 0x4b04) + uVar2;
      if (uVar9 < 0x5e) {
        UVar5 = "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                [uVar9];
        UVar12 = eg_rate_select[uVar9];
      }
      else {
        UVar12 = 0x90;
        UVar5 = '\0';
      }
      *(UINT8 *)((long)chip + 0x4b38) = UVar5;
      *(UINT8 *)((long)chip + 0x4b39) = UVar12;
      uVar9 = *(int *)((long)chip + 0x4b08) + uVar2;
      *(UINT8 *)((long)chip + 0x4b3a) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar9];
      *(UINT8 *)((long)chip + 0x4b3b) = eg_rate_select[uVar9];
      uVar9 = *(int *)((long)chip + 0x4b0c) + uVar2;
      *(UINT8 *)((long)chip + 0x4b3c) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar9];
      *(UINT8 *)((long)chip + 0x4b3d) = eg_rate_select[uVar9];
      uVar2 = uVar2 + *(int *)((long)chip + 0x4b10);
      *(UINT8 *)((long)chip + 0x4b3e) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar2];
      *(UINT8 *)((long)chip + 0x4b3f) = eg_rate_select[uVar2];
    }
    iVar7 = *(int *)(*(long *)((long)chip + 0x4b98) + (ulong)*(byte *)((long)chip + 0x4c30) * 4) +
            *(int *)((long)chip + 0x4c2c);
    if (iVar7 < 0) {
      iVar7 = iVar7 + *(int *)((long)chip + 0x46e8);
    }
    *(uint *)((long)chip + 0x4bc0) = (uint)(iVar7 * *(int *)((long)chip + 0x4bb8)) >> 1;
    bVar6 = *(byte *)((long)chip + 0x4c30) >> (*(byte *)((long)chip + 0x4ba0) & 0x1f);
    uVar2 = (uint)bVar6;
    if (uVar2 != *(byte *)((long)chip + 0x4bb4)) {
      *(byte *)((long)chip + 0x4bb4) = bVar6;
      uVar9 = *(int *)((long)chip + 0x4ba4) + uVar2;
      if (uVar9 < 0x5e) {
        UVar5 = "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                [uVar9];
        UVar12 = eg_rate_select[uVar9];
      }
      else {
        UVar12 = 0x90;
        UVar5 = '\0';
      }
      *(UINT8 *)((long)chip + 0x4bd8) = UVar5;
      *(UINT8 *)((long)chip + 0x4bd9) = UVar12;
      uVar9 = *(int *)((long)chip + 0x4ba8) + uVar2;
      *(UINT8 *)((long)chip + 0x4bda) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar9];
      *(UINT8 *)((long)chip + 0x4bdb) = eg_rate_select[uVar9];
      uVar9 = *(int *)((long)chip + 0x4bac) + uVar2;
      *(UINT8 *)((long)chip + 0x4bdc) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar9];
      *(UINT8 *)((long)chip + 0x4bdd) = eg_rate_select[uVar9];
      uVar2 = uVar2 + *(int *)((long)chip + 0x4bb0);
      *(UINT8 *)((long)chip + 0x4bde) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar2];
      *(UINT8 *)((long)chip + 0x4bdf) = eg_rate_select[uVar2];
    }
  }
  refresh_fc_eg_chan(OPN,CH_02);
  refresh_fc_eg_chan(OPN,CH_03);
  refresh_fc_eg_chan(OPN,CH_04);
  if (length == 0) {
    lVar4 = 0;
    do {
      bVar6 = *(byte *)((long)chip + lVar4 + 0x47c0);
      if ((((bVar6 & 8) != 0) &&
          (uVar2 = *(uint *)((long)chip + lVar4 + 0x47ac), 0x1ff < (int)uVar2)) &&
         (bVar13 = *(byte *)((long)chip + lVar4 + 0x47a4), 1 < bVar13)) {
        if ((bVar6 & 1) == 0) {
          if ((bVar6 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar4 + 0x479c) = 0;
          }
          else {
            pbVar1 = (byte *)((long)chip + lVar4 + 0x47c1);
            *pbVar1 = *pbVar1 ^ 4;
          }
          if (bVar13 != 4) {
            if ((uint)*(byte *)((long)chip + lVar4 + 0x4794) + *(int *)((long)chip + lVar4 + 0x4784)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar4 + 0x47a4) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar4 + 0x47ac) = 0;
              *(byte *)((long)chip + lVar4 + 0x47a4) =
                   *(int *)((long)chip + lVar4 + 0x47b0) == 0 ^ 3;
              uVar2 = 0;
            }
          }
        }
        else {
          if ((bVar6 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar4 + 0x47c1) = 4;
          }
          if ((bVar13 != 4) && (*(byte *)((long)chip + lVar4 + 0x47c1) == (bVar6 & 4))) {
            *(undefined4 *)((long)chip + lVar4 + 0x47ac) = 0x3ff;
            uVar2 = 0x3ff;
          }
        }
        uVar9 = 0x200 - uVar2 & 0x3ff;
        if (*(byte *)((long)chip + lVar4 + 0x47c1) == (bVar6 & 4)) {
          uVar9 = uVar2;
        }
        *(uint *)((long)chip + lVar4 + 0x47b4) = uVar9 + *(int *)((long)chip + lVar4 + 0x47a8);
      }
      lVar4 = lVar4 + 0x50;
    } while ((int)lVar4 != 0x140);
    lVar4 = 0;
    do {
      bVar6 = *(byte *)((long)chip + lVar4 + 0x4958);
      if ((((bVar6 & 8) != 0) &&
          (uVar2 = *(uint *)((long)chip + lVar4 + 0x4944), 0x1ff < (int)uVar2)) &&
         (bVar13 = *(byte *)((long)chip + lVar4 + 0x493c), 1 < bVar13)) {
        if ((bVar6 & 1) == 0) {
          if ((bVar6 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar4 + 0x4934) = 0;
          }
          else {
            pbVar1 = (byte *)((long)chip + lVar4 + 0x4959);
            *pbVar1 = *pbVar1 ^ 4;
          }
          if (bVar13 != 4) {
            if ((uint)*(byte *)((long)chip + lVar4 + 0x492c) + *(int *)((long)chip + lVar4 + 0x491c)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar4 + 0x493c) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar4 + 0x4944) = 0;
              *(byte *)((long)chip + lVar4 + 0x493c) =
                   *(int *)((long)chip + lVar4 + 0x4948) == 0 ^ 3;
              uVar2 = 0;
            }
          }
        }
        else {
          if ((bVar6 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar4 + 0x4959) = 4;
          }
          if ((bVar13 != 4) && (*(byte *)((long)chip + lVar4 + 0x4959) == (bVar6 & 4))) {
            *(undefined4 *)((long)chip + lVar4 + 0x4944) = 0x3ff;
            uVar2 = 0x3ff;
          }
        }
        uVar9 = 0x200 - uVar2 & 0x3ff;
        if (*(byte *)((long)chip + lVar4 + 0x4959) == (bVar6 & 4)) {
          uVar9 = uVar2;
        }
        *(uint *)((long)chip + lVar4 + 0x494c) = uVar9 + *(int *)((long)chip + lVar4 + 0x4940);
      }
      lVar4 = lVar4 + 0x50;
    } while ((int)lVar4 != 0x140);
    lVar4 = 0;
    do {
      bVar6 = *(byte *)((long)chip + lVar4 + 0x4af0);
      if ((((bVar6 & 8) != 0) &&
          (uVar2 = *(uint *)((long)chip + lVar4 + 0x4adc), 0x1ff < (int)uVar2)) &&
         (bVar13 = *(byte *)((long)chip + lVar4 + 0x4ad4), 1 < bVar13)) {
        if ((bVar6 & 1) == 0) {
          if ((bVar6 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar4 + 0x4acc) = 0;
          }
          else {
            pbVar1 = (byte *)((long)chip + lVar4 + 0x4af1);
            *pbVar1 = *pbVar1 ^ 4;
          }
          if (bVar13 != 4) {
            if ((uint)*(byte *)((long)chip + lVar4 + 0x4ac4) + *(int *)((long)chip + lVar4 + 0x4ab4)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar4 + 0x4ad4) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar4 + 0x4adc) = 0;
              *(byte *)((long)chip + lVar4 + 0x4ad4) =
                   *(int *)((long)chip + lVar4 + 0x4ae0) == 0 ^ 3;
              uVar2 = 0;
            }
          }
        }
        else {
          if ((bVar6 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar4 + 0x4af1) = 4;
          }
          if ((bVar13 != 4) && (*(byte *)((long)chip + lVar4 + 0x4af1) == (bVar6 & 4))) {
            *(undefined4 *)((long)chip + lVar4 + 0x4adc) = 0x3ff;
            uVar2 = 0x3ff;
          }
        }
        uVar9 = 0x200 - uVar2 & 0x3ff;
        if (*(byte *)((long)chip + lVar4 + 0x4af1) == (bVar6 & 4)) {
          uVar9 = uVar2;
        }
        *(uint *)((long)chip + lVar4 + 0x4ae4) = uVar9 + *(int *)((long)chip + lVar4 + 0x4ad8);
      }
      lVar4 = lVar4 + 0x50;
    } while ((int)lVar4 != 0x140);
    lVar4 = 0;
    do {
      bVar6 = *(byte *)((long)chip + lVar4 + 0x4c88);
      if ((((bVar6 & 8) != 0) &&
          (uVar2 = *(uint *)((long)chip + lVar4 + 0x4c74), 0x1ff < (int)uVar2)) &&
         (bVar13 = *(byte *)((long)chip + lVar4 + 0x4c6c), 1 < bVar13)) {
        if ((bVar6 & 1) == 0) {
          if ((bVar6 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar4 + 0x4c64) = 0;
          }
          else {
            pbVar1 = (byte *)((long)chip + lVar4 + 0x4c89);
            *pbVar1 = *pbVar1 ^ 4;
          }
          if (bVar13 != 4) {
            if ((uint)*(byte *)((long)chip + lVar4 + 0x4c5c) + *(int *)((long)chip + lVar4 + 0x4c4c)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar4 + 0x4c6c) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar4 + 0x4c74) = 0;
              *(byte *)((long)chip + lVar4 + 0x4c6c) =
                   *(int *)((long)chip + lVar4 + 0x4c78) == 0 ^ 3;
              uVar2 = 0;
            }
          }
        }
        else {
          if ((bVar6 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar4 + 0x4c89) = 4;
          }
          if ((bVar13 != 4) && (*(byte *)((long)chip + lVar4 + 0x4c89) == (bVar6 & 4))) {
            *(undefined4 *)((long)chip + lVar4 + 0x4c74) = 0x3ff;
            uVar2 = 0x3ff;
          }
        }
        uVar9 = 0x200 - uVar2 & 0x3ff;
        if (*(byte *)((long)chip + lVar4 + 0x4c89) == (bVar6 & 4)) {
          uVar9 = uVar2;
        }
        *(uint *)((long)chip + lVar4 + 0x4c7c) = uVar9 + *(int *)((long)chip + lVar4 + 0x4c70);
      }
      lVar4 = lVar4 + 0x50;
    } while ((int)lVar4 != 0x140);
    lVar4 = 0;
    do {
      bVar6 = *(byte *)((long)chip + lVar4 + 20000);
      if ((((bVar6 & 8) != 0) &&
          (uVar2 = *(uint *)((long)chip + lVar4 + 0x4e0c), 0x1ff < (int)uVar2)) &&
         (bVar13 = *(byte *)((long)chip + lVar4 + 0x4e04), 1 < bVar13)) {
        if ((bVar6 & 1) == 0) {
          if ((bVar6 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar4 + 0x4dfc) = 0;
          }
          else {
            pbVar1 = (byte *)((long)chip + lVar4 + 0x4e21);
            *pbVar1 = *pbVar1 ^ 4;
          }
          if (bVar13 != 4) {
            if ((uint)*(byte *)((long)chip + lVar4 + 0x4df4) + *(int *)((long)chip + lVar4 + 0x4de4)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar4 + 0x4e04) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar4 + 0x4e0c) = 0;
              *(byte *)((long)chip + lVar4 + 0x4e04) =
                   *(int *)((long)chip + lVar4 + 0x4e10) == 0 ^ 3;
              uVar2 = 0;
            }
          }
        }
        else {
          if ((bVar6 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar4 + 0x4e21) = 4;
          }
          if ((bVar13 != 4) && (*(byte *)((long)chip + lVar4 + 0x4e21) == (bVar6 & 4))) {
            *(undefined4 *)((long)chip + lVar4 + 0x4e0c) = 0x3ff;
            uVar2 = 0x3ff;
          }
        }
        uVar9 = 0x200 - uVar2 & 0x3ff;
        if (*(byte *)((long)chip + lVar4 + 0x4e21) == (bVar6 & 4)) {
          uVar9 = uVar2;
        }
        *(uint *)((long)chip + lVar4 + 0x4e14) = uVar9 + *(int *)((long)chip + lVar4 + 0x4e08);
      }
      lVar4 = lVar4 + 0x50;
    } while ((int)lVar4 != 0x140);
    lVar4 = 0;
    do {
      bVar6 = *(byte *)((long)chip + lVar4 + 0x4fb8);
      if ((((bVar6 & 8) != 0) &&
          (uVar2 = *(uint *)((long)chip + lVar4 + 0x4fa4), 0x1ff < (int)uVar2)) &&
         (bVar13 = *(byte *)((long)chip + lVar4 + 0x4f9c), 1 < bVar13)) {
        if ((bVar6 & 1) == 0) {
          if ((bVar6 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar4 + 0x4f94) = 0;
          }
          else {
            pbVar1 = (byte *)((long)chip + lVar4 + 0x4fb9);
            *pbVar1 = *pbVar1 ^ 4;
          }
          if (bVar13 != 4) {
            if ((uint)*(byte *)((long)chip + lVar4 + 0x4f8c) + *(int *)((long)chip + lVar4 + 0x4f7c)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar4 + 0x4f9c) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar4 + 0x4fa4) = 0;
              *(byte *)((long)chip + lVar4 + 0x4f9c) =
                   *(int *)((long)chip + lVar4 + 0x4fa8) == 0 ^ 3;
              uVar2 = 0;
            }
          }
        }
        else {
          if ((bVar6 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar4 + 0x4fb9) = 4;
          }
          if ((bVar13 != 4) && (*(byte *)((long)chip + lVar4 + 0x4fb9) == (bVar6 & 4))) {
            *(undefined4 *)((long)chip + lVar4 + 0x4fa4) = 0x3ff;
            uVar2 = 0x3ff;
          }
        }
        uVar9 = 0x200 - uVar2 & 0x3ff;
        if (*(byte *)((long)chip + lVar4 + 0x4fb9) == (bVar6 & 4)) {
          uVar9 = uVar2;
        }
        *(uint *)((long)chip + lVar4 + 0x4fac) = uVar9 + *(int *)((long)chip + lVar4 + 0x4fa0);
      }
      lVar4 = lVar4 + 0x50;
    } while ((int)lVar4 != 0x140);
  }
  else {
    uVar14 = 0;
    uVar11 = extraout_RDX;
    do {
      *(undefined4 *)((long)chip + 0x4738) = 0;
      *(undefined8 *)((long)chip + 0x4730) = 0;
      *(undefined4 *)((long)chip + 0x4748) = 0;
      *(undefined8 *)((long)chip + 0x4740) = 0;
      *(undefined8 *)((long)chip + 0x4724) = 0;
      *(undefined8 *)((long)chip + 0x4714) = 0;
      *(undefined8 *)((long)chip + 0x471c) = 0;
      lVar4 = 0x47c1;
      do {
        bVar6 = *(byte *)((long)chip + lVar4 + -1);
        if ((((bVar6 & 8) != 0) &&
            (uVar2 = *(uint *)((long)chip + lVar4 + -0x15), uVar11 = (ulong)uVar2,
            0x1ff < (int)uVar2)) && (bVar13 = *(byte *)((long)chip + lVar4 + -0x1d), 1 < bVar13)) {
          if ((bVar6 & 1) == 0) {
            if ((bVar6 & 2) == 0) {
              *(undefined4 *)((long)chip + lVar4 + -0x25) = 0;
            }
            else {
              *(byte *)((long)chip + lVar4) = *(byte *)((long)chip + lVar4) ^ 4;
            }
            if (bVar13 != 4) {
              if ((uint)*(byte *)((long)chip + lVar4 + -0x2d) + *(int *)((long)chip + lVar4 + -0x3d)
                  < 0x5e) {
                *(undefined1 *)((long)chip + lVar4 + -0x1d) = 4;
              }
              else {
                *(undefined4 *)((long)chip + lVar4 + -0x15) = 0;
                *(byte *)((long)chip + lVar4 + -0x1d) =
                     *(int *)((long)chip + lVar4 + -0x11) == 0 ^ 3;
                uVar11 = 0;
              }
            }
          }
          else {
            if ((bVar6 & 2) != 0) {
              *(undefined1 *)((long)chip + lVar4) = 4;
            }
            if ((bVar13 != 4) && (*(byte *)((long)chip + lVar4) == (bVar6 & 4))) {
              *(undefined4 *)((long)chip + lVar4 + -0x15) = 0x3ff;
              uVar11 = 0x3ff;
            }
          }
          uVar2 = 0x200 - (uint)uVar11 & 0x3ff;
          if (*(byte *)((long)chip + lVar4) == (bVar6 & 4)) {
            uVar2 = (uint)uVar11;
          }
          *(uint *)((long)chip + lVar4 + -0xd) = uVar2 + *(int *)((long)chip + lVar4 + -0x19);
        }
        lVar4 = lVar4 + 0x50;
      } while ((int)lVar4 != 0x4901);
      lVar4 = 0x4959;
      do {
        bVar6 = *(byte *)((long)chip + lVar4 + -1);
        if ((((bVar6 & 8) != 0) &&
            (uVar2 = *(uint *)((long)chip + lVar4 + -0x15), uVar11 = (ulong)uVar2,
            0x1ff < (int)uVar2)) && (bVar13 = *(byte *)((long)chip + lVar4 + -0x1d), 1 < bVar13)) {
          if ((bVar6 & 1) == 0) {
            if ((bVar6 & 2) == 0) {
              *(undefined4 *)((long)chip + lVar4 + -0x25) = 0;
            }
            else {
              *(byte *)((long)chip + lVar4) = *(byte *)((long)chip + lVar4) ^ 4;
            }
            if (bVar13 != 4) {
              if ((uint)*(byte *)((long)chip + lVar4 + -0x2d) + *(int *)((long)chip + lVar4 + -0x3d)
                  < 0x5e) {
                *(undefined1 *)((long)chip + lVar4 + -0x1d) = 4;
              }
              else {
                *(undefined4 *)((long)chip + lVar4 + -0x15) = 0;
                *(byte *)((long)chip + lVar4 + -0x1d) =
                     *(int *)((long)chip + lVar4 + -0x11) == 0 ^ 3;
                uVar11 = 0;
              }
            }
          }
          else {
            if ((bVar6 & 2) != 0) {
              *(undefined1 *)((long)chip + lVar4) = 4;
            }
            if ((bVar13 != 4) && (*(byte *)((long)chip + lVar4) == (bVar6 & 4))) {
              *(undefined4 *)((long)chip + lVar4 + -0x15) = 0x3ff;
              uVar11 = 0x3ff;
            }
          }
          uVar2 = 0x200 - (uint)uVar11 & 0x3ff;
          if (*(byte *)((long)chip + lVar4) == (bVar6 & 4)) {
            uVar2 = (uint)uVar11;
          }
          *(uint *)((long)chip + lVar4 + -0xd) = uVar2 + *(int *)((long)chip + lVar4 + -0x19);
        }
        lVar4 = lVar4 + 0x50;
      } while ((int)lVar4 != 0x4a99);
      lVar4 = 0x4af1;
      do {
        bVar6 = *(byte *)((long)chip + lVar4 + -1);
        if ((((bVar6 & 8) != 0) &&
            (uVar2 = *(uint *)((long)chip + lVar4 + -0x15), uVar11 = (ulong)uVar2,
            0x1ff < (int)uVar2)) && (bVar13 = *(byte *)((long)chip + lVar4 + -0x1d), 1 < bVar13)) {
          if ((bVar6 & 1) == 0) {
            if ((bVar6 & 2) == 0) {
              *(undefined4 *)((long)chip + lVar4 + -0x25) = 0;
            }
            else {
              *(byte *)((long)chip + lVar4) = *(byte *)((long)chip + lVar4) ^ 4;
            }
            if (bVar13 != 4) {
              if ((uint)*(byte *)((long)chip + lVar4 + -0x2d) + *(int *)((long)chip + lVar4 + -0x3d)
                  < 0x5e) {
                *(undefined1 *)((long)chip + lVar4 + -0x1d) = 4;
              }
              else {
                *(undefined4 *)((long)chip + lVar4 + -0x15) = 0;
                *(byte *)((long)chip + lVar4 + -0x1d) =
                     *(int *)((long)chip + lVar4 + -0x11) == 0 ^ 3;
                uVar11 = 0;
              }
            }
          }
          else {
            if ((bVar6 & 2) != 0) {
              *(undefined1 *)((long)chip + lVar4) = 4;
            }
            if ((bVar13 != 4) && (*(byte *)((long)chip + lVar4) == (bVar6 & 4))) {
              *(undefined4 *)((long)chip + lVar4 + -0x15) = 0x3ff;
              uVar11 = 0x3ff;
            }
          }
          uVar2 = 0x200 - (uint)uVar11 & 0x3ff;
          if (*(byte *)((long)chip + lVar4) == (bVar6 & 4)) {
            uVar2 = (uint)uVar11;
          }
          *(uint *)((long)chip + lVar4 + -0xd) = uVar2 + *(int *)((long)chip + lVar4 + -0x19);
        }
        lVar4 = lVar4 + 0x50;
      } while ((int)lVar4 != 0x4c31);
      lVar4 = 0x4c89;
      do {
        bVar6 = *(byte *)((long)chip + lVar4 + -1);
        if ((((bVar6 & 8) != 0) &&
            (uVar2 = *(uint *)((long)chip + lVar4 + -0x15), uVar11 = (ulong)uVar2,
            0x1ff < (int)uVar2)) && (bVar13 = *(byte *)((long)chip + lVar4 + -0x1d), 1 < bVar13)) {
          if ((bVar6 & 1) == 0) {
            if ((bVar6 & 2) == 0) {
              *(undefined4 *)((long)chip + lVar4 + -0x25) = 0;
            }
            else {
              *(byte *)((long)chip + lVar4) = *(byte *)((long)chip + lVar4) ^ 4;
            }
            if (bVar13 != 4) {
              if ((uint)*(byte *)((long)chip + lVar4 + -0x2d) + *(int *)((long)chip + lVar4 + -0x3d)
                  < 0x5e) {
                *(undefined1 *)((long)chip + lVar4 + -0x1d) = 4;
              }
              else {
                *(undefined4 *)((long)chip + lVar4 + -0x15) = 0;
                *(byte *)((long)chip + lVar4 + -0x1d) =
                     *(int *)((long)chip + lVar4 + -0x11) == 0 ^ 3;
                uVar11 = 0;
              }
            }
          }
          else {
            if ((bVar6 & 2) != 0) {
              *(undefined1 *)((long)chip + lVar4) = 4;
            }
            if ((bVar13 != 4) && (*(byte *)((long)chip + lVar4) == (bVar6 & 4))) {
              *(undefined4 *)((long)chip + lVar4 + -0x15) = 0x3ff;
              uVar11 = 0x3ff;
            }
          }
          uVar2 = 0x200 - (uint)uVar11 & 0x3ff;
          if (*(byte *)((long)chip + lVar4) == (bVar6 & 4)) {
            uVar2 = (uint)uVar11;
          }
          *(uint *)((long)chip + lVar4 + -0xd) = uVar2 + *(int *)((long)chip + lVar4 + -0x19);
        }
        lVar4 = lVar4 + 0x50;
      } while ((int)lVar4 != 0x4dc9);
      lVar4 = 0x4e21;
      do {
        bVar6 = *(byte *)((long)chip + lVar4 + -1);
        if ((((bVar6 & 8) != 0) &&
            (uVar2 = *(uint *)((long)chip + lVar4 + -0x15), uVar11 = (ulong)uVar2,
            0x1ff < (int)uVar2)) && (bVar13 = *(byte *)((long)chip + lVar4 + -0x1d), 1 < bVar13)) {
          if ((bVar6 & 1) == 0) {
            if ((bVar6 & 2) == 0) {
              *(undefined4 *)((long)chip + lVar4 + -0x25) = 0;
            }
            else {
              *(byte *)((long)chip + lVar4) = *(byte *)((long)chip + lVar4) ^ 4;
            }
            if (bVar13 != 4) {
              if ((uint)*(byte *)((long)chip + lVar4 + -0x2d) + *(int *)((long)chip + lVar4 + -0x3d)
                  < 0x5e) {
                *(undefined1 *)((long)chip + lVar4 + -0x1d) = 4;
              }
              else {
                *(undefined4 *)((long)chip + lVar4 + -0x15) = 0;
                *(byte *)((long)chip + lVar4 + -0x1d) =
                     *(int *)((long)chip + lVar4 + -0x11) == 0 ^ 3;
                uVar11 = 0;
              }
            }
          }
          else {
            if ((bVar6 & 2) != 0) {
              *(undefined1 *)((long)chip + lVar4) = 4;
            }
            if ((bVar13 != 4) && (*(byte *)((long)chip + lVar4) == (bVar6 & 4))) {
              *(undefined4 *)((long)chip + lVar4 + -0x15) = 0x3ff;
              uVar11 = 0x3ff;
            }
          }
          uVar2 = 0x200 - (uint)uVar11 & 0x3ff;
          if (*(byte *)((long)chip + lVar4) == (bVar6 & 4)) {
            uVar2 = (uint)uVar11;
          }
          *(uint *)((long)chip + lVar4 + -0xd) = uVar2 + *(int *)((long)chip + lVar4 + -0x19);
        }
        lVar4 = lVar4 + 0x50;
      } while ((int)lVar4 != 0x4f61);
      lVar4 = 0x4fb9;
      do {
        bVar6 = *(byte *)((long)chip + lVar4 + -1);
        if ((((bVar6 & 8) != 0) &&
            (uVar2 = *(uint *)((long)chip + lVar4 + -0x15), uVar11 = (ulong)uVar2,
            0x1ff < (int)uVar2)) && (bVar13 = *(byte *)((long)chip + lVar4 + -0x1d), 1 < bVar13)) {
          if ((bVar6 & 1) == 0) {
            if ((bVar6 & 2) == 0) {
              *(undefined4 *)((long)chip + lVar4 + -0x25) = 0;
            }
            else {
              *(byte *)((long)chip + lVar4) = *(byte *)((long)chip + lVar4) ^ 4;
            }
            if (bVar13 != 4) {
              if ((uint)*(byte *)((long)chip + lVar4 + -0x2d) + *(int *)((long)chip + lVar4 + -0x3d)
                  < 0x5e) {
                *(undefined1 *)((long)chip + lVar4 + -0x1d) = 4;
              }
              else {
                *(undefined4 *)((long)chip + lVar4 + -0x15) = 0;
                *(byte *)((long)chip + lVar4 + -0x1d) =
                     *(int *)((long)chip + lVar4 + -0x11) == 0 ^ 3;
                uVar11 = 0;
              }
            }
          }
          else {
            if ((bVar6 & 2) != 0) {
              *(undefined1 *)((long)chip + lVar4) = 4;
            }
            if ((bVar13 != 4) && (*(byte *)((long)chip + lVar4) == (bVar6 & 4))) {
              *(undefined4 *)((long)chip + lVar4 + -0x15) = 0x3ff;
              uVar11 = 0x3ff;
            }
          }
          uVar2 = 0x200 - (uint)uVar11 & 0x3ff;
          if (*(byte *)((long)chip + lVar4) == (bVar6 & 4)) {
            uVar2 = (uint)uVar11;
          }
          *(uint *)((long)chip + lVar4 + -0xd) = uVar2 + *(int *)((long)chip + lVar4 + -0x19);
        }
        lVar4 = lVar4 + 0x50;
      } while ((int)lVar4 != 0x50f9);
      chan_calc(OPN,CH,(int)uVar11);
      chan_calc(OPN,CH_00,chnum);
      chan_calc(OPN,CH_01,chnum_00);
      chan_calc(OPN,CH_02,chnum_01);
      chan_calc(OPN,CH_03,chnum_02);
      chan_calc(OPN,CH_04,chnum_03);
      if ((*(char *)((long)chip + 0x53d2) < '\0') && (*(char *)((long)chip + 0x5408) == '\0')) {
        YM_DELTAT_ADPCM_CALC((YM_DELTAT *)((long)chip + 0x5368));
      }
      lVar4 = 0x5120;
      do {
        if (*(char *)((long)chip + lVar4) != '\0') {
          ADPCMA_calc_chan((YM2610 *)chip,(ADPCM_CH *)((long)chip + lVar4));
        }
        lVar4 = lVar4 + 0x40;
      } while (lVar4 != 0x52a0);
      uVar2 = *(uint *)((long)chip + 0x46f8);
      if (uVar2 != 0) {
        uVar9 = *(int *)((long)chip + 0x46f0) + *(int *)((long)chip + 0x46f4);
        *(uint *)((long)chip + 0x46f0) = uVar9;
        if (uVar2 <= uVar9) {
          bVar6 = *(byte *)((long)chip + 0x46ec);
          do {
            uVar9 = uVar9 - uVar2;
            bVar13 = bVar6 + 1;
            bVar6 = bVar13 & 0x7f;
          } while (uVar2 <= uVar9);
          uVar10 = (uint)(byte)(bVar13 * '\x02');
          uVar2 = uVar10 & 0x7e;
          if (bVar6 < 0x40) {
            uVar2 = uVar10 ^ 0x7e;
          }
          *(uint *)((long)chip + 0x46fc) = uVar2;
          *(uint *)((long)chip + 0x46f0) = uVar9;
          *(byte *)((long)chip + 0x46ec) = bVar6;
          *(uint *)((long)chip + 0x4700) = (uint)(bVar6 >> 2);
        }
      }
      uVar2 = *(uint *)((long)chip + 0x6e4);
      uVar9 = *(int *)((long)chip + 0x6dc) + *(int *)((long)chip + 0x6e0);
      *(uint *)((long)chip + 0x6dc) = uVar9;
      if (uVar2 <= uVar9) {
        do {
          *(uint *)((long)chip + 0x6dc) = uVar9 - uVar2;
          *(int *)((long)chip + 0x6d8) = *(int *)((long)chip + 0x6d8) + 1;
          advance_eg_channel(OPN,(FM_SLOT *)CH);
          advance_eg_channel(OPN,(FM_SLOT *)CH_00);
          advance_eg_channel(OPN,(FM_SLOT *)CH_01);
          advance_eg_channel(OPN,(FM_SLOT *)CH_02);
          advance_eg_channel(OPN,(FM_SLOT *)CH_03);
          advance_eg_channel(OPN,(FM_SLOT *)CH_04);
          uVar9 = *(uint *)((long)chip + 0x6dc);
          uVar2 = *(uint *)((long)chip + 0x6e4);
        } while (uVar2 <= uVar9);
      }
      uVar2 = (*(uint *)((long)chip + 0x4728) & *(uint *)((long)chip + 0x6d4)) +
              (*(uint *)((long)chip + 0x4724) & *(uint *)((long)chip + 0x6cc)) +
              (*(uint *)((long)chip + 0x4720) & *(uint *)((long)chip + 0x6c4)) +
              (*(uint *)((long)chip + 0x471c) & *(uint *)((long)chip + 0x6bc)) +
              (*(uint *)((long)chip + 0x4718) & *(uint *)((long)chip + 0x6b4)) +
              (*(uint *)((long)chip + 0x4714) & *(uint *)((long)chip + 0x6ac)) +
              (*(int *)((long)chip + 0x4748) + *(int *)((long)chip + 0x4740) >> 8) +
              (*(int *)((long)chip + 0x4738) + *(int *)((long)chip + 0x4730)) * 2;
      uVar11 = (ulong)uVar2;
      local_78[uVar14] =
           (*(uint *)((long)chip + 0x6d0) & *(uint *)((long)chip + 0x4728)) +
           (*(uint *)((long)chip + 0x6c8) & *(uint *)((long)chip + 0x4724)) +
           (*(uint *)((long)chip + 0x6c0) & *(uint *)((long)chip + 0x4720)) +
           (*(uint *)((long)chip + 0x6b8) & *(uint *)((long)chip + 0x471c)) +
           (*(uint *)((long)chip + 0x6b0) & *(uint *)((long)chip + 0x4718)) +
           (*(uint *)((long)chip + 0x6a8) & *(uint *)((long)chip + 0x4714)) +
           (*(int *)((long)chip + 0x4744) + *(int *)((long)chip + 0x4748) >> 8) +
           (*(int *)((long)chip + 0x4734) + *(int *)((long)chip + 0x4738)) * 2;
      local_70[uVar14] = uVar2;
      *(char *)((long)chip + 0x69c) = *(char *)((long)chip + 0x69c) << 1;
      iVar7 = *(int *)((long)chip + 0x23c);
      if (((iVar7 != 0) && (*(long *)((long)chip + 0x648) == 0)) &&
         (iVar8 = (int)(*(double *)((long)chip + 0x220) * 4096.0), iVar3 = iVar7 - iVar8,
         *(int *)((long)chip + 0x23c) = iVar3, iVar3 == 0 || iVar7 < iVar8)) {
        if ((*(byte *)((long)chip + 0x230) & 4) == 0) {
LAB_0012f5e9:
          iVar7 = 0x400 - *(int *)((long)chip + 0x238);
        }
        else {
          bVar6 = *(byte *)((long)chip + 0x22f) | 1;
          *(byte *)((long)chip + 0x22f) = bVar6;
          if ((*(char *)((long)chip + 0x22d) != '\0') ||
             ((*(byte *)((long)chip + 0x22e) & bVar6) == 0)) goto LAB_0012f5e9;
          *(undefined1 *)((long)chip + 0x22d) = 1;
          if (*(code **)((long)chip + 0x650) == (code *)0x0) goto LAB_0012f5e9;
          (**(code **)((long)chip + 0x650))(*(undefined8 *)((long)chip + 0x210),1);
          iVar7 = 0x400 - *(int *)((long)chip + 0x238);
          *(int *)((long)chip + 0x23c) = iVar7;
          if (*(code **)((long)chip + 0x648) != (code *)0x0) {
            (**(code **)((long)chip + 0x648))
                      (*(undefined8 *)((long)chip + 0x210),0,iVar7 * *(int *)((long)chip + 0x228),
                       *(undefined4 *)((long)chip + 0x218));
            iVar7 = *(int *)((long)chip + 0x23c);
          }
        }
        uVar11 = (ulong)(uint)(iVar7 << 0xc);
        *(int *)((long)chip + 0x23c) = iVar7 << 0xc;
        if ((*(uint *)((long)chip + 0x230) & 0xc0) == 0x80) {
          CSMKeyControl(OPN,CH_01);
          uVar11 = extraout_RDX_00;
        }
      }
      if ((*(byte *)((long)chip + 0x69c) & 2) != 0) {
        if ((*(char *)((long)chip + 0x4af2) == '\0') && (1 < *(byte *)((long)chip + 0x4ad4))) {
          *(undefined1 *)((long)chip + 0x4ad4) = 1;
          if ((*(byte *)((long)chip + 0x4af0) & 8) != 0) {
            uVar11 = (ulong)*(byte *)((long)chip + 0x4af1);
            uVar2 = *(uint *)((long)chip + 0x4adc);
            if ((*(byte *)((long)chip + 0x4af0) & 4) != *(byte *)((long)chip + 0x4af1)) {
              uVar2 = 0x200 - uVar2 & 0x3ff;
              *(uint *)((long)chip + 0x4adc) = uVar2;
            }
            if (0x1ff < (int)uVar2) {
              *(undefined4 *)((long)chip + 0x4adc) = 0x3ff;
              *(undefined1 *)((long)chip + 0x4ad4) = 0;
              uVar2 = 0x3ff;
            }
            *(uint *)((long)chip + 0x4ae4) = uVar2 + *(int *)((long)chip + 0x4ad8);
          }
        }
        if ((*(char *)((long)chip + 0x4b92) == '\0') && (1 < *(byte *)((long)chip + 0x4b74))) {
          *(undefined1 *)((long)chip + 0x4b74) = 1;
          if ((*(byte *)((long)chip + 0x4b90) & 8) != 0) {
            uVar11 = (ulong)*(byte *)((long)chip + 0x4b91);
            uVar2 = *(uint *)((long)chip + 0x4b7c);
            if ((*(byte *)((long)chip + 0x4b90) & 4) != *(byte *)((long)chip + 0x4b91)) {
              uVar2 = 0x200 - uVar2 & 0x3ff;
              *(uint *)((long)chip + 0x4b7c) = uVar2;
            }
            if (0x1ff < (int)uVar2) {
              *(undefined4 *)((long)chip + 0x4b7c) = 0x3ff;
              *(undefined1 *)((long)chip + 0x4b74) = 0;
              uVar2 = 0x3ff;
            }
            *(uint *)((long)chip + 0x4b84) = uVar2 + *(int *)((long)chip + 0x4b78);
          }
        }
        if ((*(char *)((long)chip + 0x4b42) == '\0') && (1 < *(byte *)((long)chip + 0x4b24))) {
          *(undefined1 *)((long)chip + 0x4b24) = 1;
          if ((*(byte *)((long)chip + 0x4b40) & 8) != 0) {
            uVar11 = (ulong)*(byte *)((long)chip + 0x4b41);
            uVar2 = *(uint *)((long)chip + 0x4b2c);
            if ((*(byte *)((long)chip + 0x4b40) & 4) != *(byte *)((long)chip + 0x4b41)) {
              uVar2 = 0x200 - uVar2 & 0x3ff;
              *(uint *)((long)chip + 0x4b2c) = uVar2;
            }
            if (0x1ff < (int)uVar2) {
              *(undefined4 *)((long)chip + 0x4b2c) = 0x3ff;
              *(undefined1 *)((long)chip + 0x4b24) = 0;
              uVar2 = 0x3ff;
            }
            *(uint *)((long)chip + 0x4b34) = uVar2 + *(int *)((long)chip + 0x4b28);
          }
        }
        if ((*(char *)((long)chip + 0x4be2) == '\0') && (1 < *(byte *)((long)chip + 0x4bc4))) {
          *(undefined1 *)((long)chip + 0x4bc4) = 1;
          if ((*(byte *)((long)chip + 0x4be0) & 8) != 0) {
            uVar11 = (ulong)*(byte *)((long)chip + 0x4be1);
            uVar2 = *(uint *)((long)chip + 0x4bcc);
            if ((*(byte *)((long)chip + 0x4be0) & 4) != *(byte *)((long)chip + 0x4be1)) {
              uVar2 = 0x200 - uVar2 & 0x3ff;
              *(uint *)((long)chip + 0x4bcc) = uVar2;
            }
            if (0x1ff < (int)uVar2) {
              *(undefined4 *)((long)chip + 0x4bcc) = 0x3ff;
              *(undefined1 *)((long)chip + 0x4bc4) = 0;
              uVar2 = 0x3ff;
            }
            *(uint *)((long)chip + 0x4bd4) = uVar2 + *(int *)((long)chip + 0x4bc8);
          }
        }
        *(undefined1 *)((long)chip + 0x69c) = 0;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != length);
  }
  iVar7 = *(int *)((long)chip + 0x244);
  if (iVar7 == 0) {
    return;
  }
  if (*(long *)((long)chip + 0x648) != 0) {
    return;
  }
  iVar8 = (int)((double)length * *(double *)((long)chip + 0x220) * 4096.0);
  iVar3 = iVar7 - iVar8;
  *(int *)((long)chip + 0x244) = iVar3;
  if (iVar3 != 0 && iVar8 <= iVar7) {
    return;
  }
  if ((*(byte *)((long)chip + 0x230) & 8) != 0) {
    bVar6 = *(byte *)((long)chip + 0x22f) | 2;
    *(byte *)((long)chip + 0x22f) = bVar6;
    if ((*(char *)((long)chip + 0x22d) == '\0') && ((*(byte *)((long)chip + 0x22e) & bVar6) != 0)) {
      *(undefined1 *)((long)chip + 0x22d) = 1;
      if (*(code **)((long)chip + 0x650) != (code *)0x0) {
        (**(code **)((long)chip + 0x650))(*(undefined8 *)((long)chip + 0x210),1);
        iVar7 = (uint)*(byte *)((long)chip + 0x240) * -0x10 + 0x1000;
        *(int *)((long)chip + 0x244) = iVar7;
        if (*(code **)((long)chip + 0x648) != (code *)0x0) {
          (**(code **)((long)chip + 0x648))
                    (*(undefined8 *)((long)chip + 0x210),1,iVar7 * *(int *)((long)chip + 0x228),
                     *(undefined4 *)((long)chip + 0x218));
          iVar7 = *(int *)((long)chip + 0x244);
        }
        goto LAB_0012f90c;
      }
    }
  }
  iVar7 = (uint)*(byte *)((long)chip + 0x240) * -0x10 + 0x1000;
LAB_0012f90c:
  *(int *)((long)chip + 0x244) = iVar7 << 0xc;
  return;
}

Assistant:

void ym2610b_update_one(void *chip, UINT32 length, DEV_SMPL **buffer)
{
	YM2610 *F2610 = (YM2610 *)chip;
	FM_OPN *OPN   = &F2610->OPN;
	YM_DELTAT *DELTAT = &F2610->deltaT;
	UINT32 i;
	UINT8 j;
	DEV_SMPL  *bufL,*bufR;
	FM_CH   *cch[6];
	INT32 *out_fm = OPN->out_fm;

	/* buffer setup */
	if (buffer != NULL)
	{
		bufL = buffer[0];
		bufR = buffer[1];
	}
	else
	{
		bufL = bufR = NULL;
	}

	cch[0] = &F2610->CH[0];
	cch[1] = &F2610->CH[1];
	cch[2] = &F2610->CH[2];
	cch[3] = &F2610->CH[3];
	cch[4] = &F2610->CH[4];
	cch[5] = &F2610->CH[5];

	/* refresh PG and EG */
	refresh_fc_eg_chan( OPN, cch[0] );
	refresh_fc_eg_chan( OPN, cch[1] );
	if( (OPN->ST.mode & 0xc0) )
	{
		/* 3SLOT MODE */
		if( cch[2]->SLOT[SLOT1].Incr==-1)
		{
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT1] , OPN->SL3.fc[1] , OPN->SL3.kcode[1] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT2] , OPN->SL3.fc[2] , OPN->SL3.kcode[2] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT3] , OPN->SL3.fc[0] , OPN->SL3.kcode[0] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT4] , cch[2]->fc , cch[2]->kcode );
		}
	}
	else
		refresh_fc_eg_chan( OPN, cch[2] );
	refresh_fc_eg_chan( OPN, cch[3] );
	refresh_fc_eg_chan( OPN, cch[4] );
	refresh_fc_eg_chan( OPN, cch[5] );
	if (! length)
	{
		update_ssg_eg_channel(&cch[0]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[3]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[4]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[5]->SLOT[SLOT1]);
	}

	/* buffering */
	for(i=0; i < length ; i++)
	{
		/* clear output acc. */
		OPN->out_adpcm[OUTD_LEFT] = OPN->out_adpcm[OUTD_RIGHT] = OPN->out_adpcm[OUTD_CENTER] = 0;
		OPN->out_delta[OUTD_LEFT] = OPN->out_delta[OUTD_RIGHT] = OPN->out_delta[OUTD_CENTER] = 0;
		/* clear outputs */
		out_fm[0] = 0;
		out_fm[1] = 0;
		out_fm[2] = 0;
		out_fm[3] = 0;
		out_fm[4] = 0;
		out_fm[5] = 0;

		/* update SSG-EG output */
		update_ssg_eg_channel(&cch[0]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[3]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[4]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[5]->SLOT[SLOT1]);

		/* calculate FM */
		chan_calc(OPN, cch[0], 0 );
		chan_calc(OPN, cch[1], 1 );
		chan_calc(OPN, cch[2], 2 );
		chan_calc(OPN, cch[3], 3 );
		chan_calc(OPN, cch[4], 4 );
		chan_calc(OPN, cch[5], 5 );

		/* deltaT ADPCM */
		if( DELTAT->portstate&0x80 && ! F2610->MuteDeltaT )
			YM_DELTAT_ADPCM_CALC(DELTAT);

		/* ADPCMA */
		for( j = 0; j < 6; j++ )
		{
			if( F2610->adpcm[j].flag )
				ADPCMA_calc_chan( F2610, &F2610->adpcm[j]);
		}

		/* advance LFO */
		advance_lfo(OPN);

		/* advance envelope generator */
		OPN->eg_timer += OPN->eg_timer_add;
		while (OPN->eg_timer >= OPN->eg_timer_overflow)
		{
			OPN->eg_timer -= OPN->eg_timer_overflow;
			OPN->eg_cnt++;

			advance_eg_channel(OPN, &cch[0]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[1]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[2]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[3]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[4]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[5]->SLOT[SLOT1]);
		}


		/* buffering */
		{
			DEV_SMPL lt,rt;

			lt =  (OPN->out_adpcm[OUTD_LEFT]  + OPN->out_adpcm[OUTD_CENTER])<<1;
			rt =  (OPN->out_adpcm[OUTD_RIGHT] + OPN->out_adpcm[OUTD_CENTER])<<1;
			lt += (OPN->out_delta[OUTD_LEFT]  + OPN->out_delta[OUTD_CENTER])>>8;
			rt += (OPN->out_delta[OUTD_RIGHT] + OPN->out_delta[OUTD_CENTER])>>8;

			lt += (out_fm[0] & OPN->pan[0]);
			rt += (out_fm[0] & OPN->pan[1]);
			lt += (out_fm[1] & OPN->pan[2]);
			rt += (out_fm[1] & OPN->pan[3]);
			lt += (out_fm[2] & OPN->pan[4]);
			rt += (out_fm[2] & OPN->pan[5]);
			lt += (out_fm[3] & OPN->pan[6]);
			rt += (out_fm[3] & OPN->pan[7]);
			lt += (out_fm[4] & OPN->pan[8]);
			rt += (out_fm[4] & OPN->pan[9]);
			lt += (out_fm[5] & OPN->pan[10]);
			rt += (out_fm[5] & OPN->pan[11]);

			//lt >>= 1; // the shift right is verified on YM2610
			//rt >>= 1;

			/* buffering */
			bufL[i] = lt;
			bufR[i] = rt;
		}

		/* CSM mode: if CSM Key ON has occured, CSM Key OFF need to be sent       */
		/* only if Timer A does not overflow again (i.e CSM Key ON not set again) */
		OPN->SL3.key_csm <<= 1;

		/* timer A control */
		INTERNAL_TIMER_A( &OPN->ST , cch[2] )

		/* CSM Mode Key ON still disabled */
		if (OPN->SL3.key_csm & 2)
		{
			/* CSM Mode Key OFF (verified by Nemesis on real hardware) */
			FM_KEYOFF_CSM(cch[2],SLOT1);
			FM_KEYOFF_CSM(cch[2],SLOT2);
			FM_KEYOFF_CSM(cch[2],SLOT3);
			FM_KEYOFF_CSM(cch[2],SLOT4);
			OPN->SL3.key_csm = 0;
		}
	}

	/* timer B control */
	INTERNAL_TIMER_B(&OPN->ST,length)
}